

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

void delete_filter(rar_filter *filter)

{
  rar_filter *prVar1;
  
  if (filter != (rar_filter *)0x0) {
    do {
      prVar1 = filter->next;
      free(filter->globaldata);
      free(filter);
      filter = prVar1;
    } while (prVar1 != (rar_filter *)0x0);
  }
  return;
}

Assistant:

static void
delete_filter(struct rar_filter *filter)
{
  while (filter)
  {
    struct rar_filter *next = filter->next;
    free(filter->globaldata);
    free(filter);
    filter = next;
  }
}